

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseGuidedSectionBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  GUIDED_SECTION_PARSING_DATA_ *v;
  USTATUS UVar4;
  CBString local_520;
  UByteArray local_508;
  char acStack_4e8 [8];
  GUIDED_SECTION_PARSING_DATA pdata;
  CBString local_4c8;
  CBString local_4b0;
  CBString local_498;
  CBString local_480;
  CBString local_468;
  UByteArray local_450;
  USTATUS local_430;
  USTATUS result_4;
  CBString local_410;
  CBString local_3f8;
  CBString local_3e0;
  CBString local_3c8;
  UByteArray local_3b0;
  USTATUS local_390;
  USTATUS result_3;
  CBString local_370;
  CBString local_358;
  CBString local_340;
  CBString local_328;
  CBString local_310;
  CBString local_2f8;
  UByteArray local_2e0;
  USTATUS local_2c0;
  USTATUS result_2;
  CBString local_2a0;
  CBString local_288;
  CBString local_270;
  CBString local_258;
  CBString local_240;
  CBString local_228;
  UByteArray local_210;
  USTATUS local_1f0;
  USTATUS result_1;
  CBString local_1d0;
  CBString local_1b8;
  CBString local_1a0;
  CBString local_188;
  undefined4 local_16c;
  CBString local_168;
  CBString local_150;
  CBString local_138;
  UByteArray local_120;
  USTATUS local_100;
  USTATUS result;
  UByteArray baGuid;
  UINT32 dictionarySize;
  UINT8 algorithm;
  bool parseCurrentSection;
  CBString info;
  UByteArray efiDecompressed;
  UByteArray processed;
  GUIDED_SECTION_PARSING_DATA *pdata_1;
  UByteArray data;
  EFI_GUID guid;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  bVar1 = UModelIndex::isValid(index);
  if (!bVar1) {
    return 1;
  }
  memset((void *)((long)&data.d.field_2 + 8),0,0x10);
  bVar1 = TreeModel::hasEmptyParsingData(this->model,index);
  if (!bVar1) {
    TreeModel::parsingData((UByteArray *)&pdata_1,this->model,index);
    v = (GUIDED_SECTION_PARSING_DATA_ *)UByteArray::constData((UByteArray *)&pdata_1);
    readUnaligned<GUIDED_SECTION_PARSING_DATA_>
              ((GUIDED_SECTION_PARSING_DATA_ *)((long)&processed.d.field_2 + 8),v);
    data.d.field_2._8_8_ = processed.d.field_2._8_8_;
    UByteArray::~UByteArray((UByteArray *)&pdata_1);
  }
  TreeModel::body((UByteArray *)((long)&efiDecompressed.d.field_2 + 8),this->model,index);
  UByteArray::UByteArray((UByteArray *)&info.super_tagbstring.data);
  Bstrlib::CBString::CBString((CBString *)&dictionarySize);
  baGuid.d.field_2._M_local_buf[0xf] = '\x01';
  baGuid.d.field_2._M_local_buf[0xe] = '\x01';
  baGuid.d.field_2._8_4_ = 0;
  UByteArray::UByteArray((UByteArray *)&result,data.d.field_2._M_local_buf + 8,0x10);
  bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_TIANO);
  if (bVar1) {
    TreeModel::body(&local_120,this->model,index);
    UVar4 = decompress(&local_120,'\x01',(UINT8 *)(baGuid.d.field_2._M_local_buf + 0xe),
                       (UINT32 *)(baGuid.d.field_2._M_local_buf + 8),
                       (UByteArray *)((long)&efiDecompressed.d.field_2 + 8),
                       (UByteArray *)&info.super_tagbstring.data);
    UByteArray::~UByteArray(&local_120);
    local_100 = UVar4;
    if (UVar4 != 0) {
      usprintf(&local_150,"%s: decompression failed with error ","parseGuidedSectionBody");
      errorCodeToUString(&local_168,local_100);
      Bstrlib::CBString::operator+(&local_138,&local_150,&local_168);
      msg(this,&local_138,index);
      Bstrlib::CBString::~CBString(&local_138);
      Bstrlib::CBString::~CBString(&local_168);
      Bstrlib::CBString::~CBString(&local_150);
      this_local = (FfsParser *)0x0;
      goto LAB_00133e3f;
    }
    if (baGuid.d.field_2._M_local_buf[0xe] == '\x04') {
      UVar4 = parseSections(this,(UByteArray *)((long)&efiDecompressed.d.field_2 + 8),index,false);
      if (UVar4 == 0) {
        baGuid.d.field_2._M_local_buf[0xe] = '\x03';
      }
      else {
        UVar4 = parseSections(this,(UByteArray *)&info.super_tagbstring.data,index,false);
        if (UVar4 == 0) {
          baGuid.d.field_2._M_local_buf[0xe] = '\x02';
          UByteArray::operator=
                    ((UByteArray *)((long)&efiDecompressed.d.field_2 + 8),
                     (UByteArray *)&info.super_tagbstring.data);
        }
        else {
          usprintf(&local_188,
                   "%s: can\'t guess the correct decompression algorithm, both preparse steps are failed"
                   ,"parseGuidedSectionBody");
          msg(this,&local_188,index);
          Bstrlib::CBString::~CBString(&local_188);
          baGuid.d.field_2._M_local_buf[0xf] = '\0';
        }
      }
    }
    Bstrlib::CBString::CBString(&local_1b8,"\nCompression algorithm: ");
    compressionTypeToUString(&local_1d0,baGuid.d.field_2._M_local_buf[0xe]);
    Bstrlib::CBString::operator+(&local_1a0,&local_1b8,&local_1d0);
    Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_1a0);
    Bstrlib::CBString::~CBString(&local_1a0);
    Bstrlib::CBString::~CBString(&local_1d0);
    Bstrlib::CBString::~CBString(&local_1b8);
    uVar2 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
    uVar3 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
    usprintf((CBString *)&result_1,"\nDecompressed size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
    Bstrlib::CBString::operator+=((CBString *)&dictionarySize,(CBString *)&result_1);
    Bstrlib::CBString::~CBString((CBString *)&result_1);
  }
  else {
    bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_LZMA);
    if (((bVar1) ||
        (bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_LZMA_HP), bVar1))
       || (bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_LZMA_MS), bVar1)
       ) {
      TreeModel::body(&local_210,this->model,index);
      UVar4 = decompress(&local_210,'\x02',(UINT8 *)(baGuid.d.field_2._M_local_buf + 0xe),
                         (UINT32 *)(baGuid.d.field_2._M_local_buf + 8),
                         (UByteArray *)((long)&efiDecompressed.d.field_2 + 8),
                         (UByteArray *)&info.super_tagbstring.data);
      UByteArray::~UByteArray(&local_210);
      local_1f0 = UVar4;
      if (UVar4 != 0) {
        usprintf(&local_240,"%s: decompression failed with error ","parseGuidedSectionBody");
        errorCodeToUString(&local_258,local_1f0);
        Bstrlib::CBString::operator+(&local_228,&local_240,&local_258);
        msg(this,&local_228,index);
        Bstrlib::CBString::~CBString(&local_228);
        Bstrlib::CBString::~CBString(&local_258);
        Bstrlib::CBString::~CBString(&local_240);
        this_local = (FfsParser *)0x0;
        goto LAB_00133e3f;
      }
      if (baGuid.d.field_2._M_local_buf[0xe] == '\x05') {
        Bstrlib::CBString::CBString(&local_270,"\nCompression algorithm: LZMA");
        Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_270);
        Bstrlib::CBString::~CBString(&local_270);
        uVar2 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
        uVar3 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
        usprintf(&local_288,"\nDecompressed size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
        Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_288);
        Bstrlib::CBString::~CBString(&local_288);
        usprintf(&local_2a0,"\nLZMA dictionary size: %Xh",(ulong)(uint)baGuid.d.field_2._8_4_);
        Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_2a0);
        Bstrlib::CBString::~CBString(&local_2a0);
      }
      else {
        Bstrlib::CBString::CBString((CBString *)&result_2,"\nCompression algorithm: unknown");
        Bstrlib::CBString::operator+=((CBString *)&dictionarySize,(CBString *)&result_2);
        Bstrlib::CBString::~CBString((CBString *)&result_2);
        baGuid.d.field_2._M_local_buf[0xf] = '\0';
      }
    }
    else {
      bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_LZMAF86);
      if (bVar1) {
        TreeModel::body(&local_2e0,this->model,index);
        UVar4 = decompress(&local_2e0,0x86,(UINT8 *)(baGuid.d.field_2._M_local_buf + 0xe),
                           (UINT32 *)(baGuid.d.field_2._M_local_buf + 8),
                           (UByteArray *)((long)&efiDecompressed.d.field_2 + 8),
                           (UByteArray *)&info.super_tagbstring.data);
        UByteArray::~UByteArray(&local_2e0);
        local_2c0 = UVar4;
        if (UVar4 != 0) {
          usprintf(&local_310,"%s: decompression failed with error ","parseGuidedSectionBody");
          errorCodeToUString(&local_328,local_2c0);
          Bstrlib::CBString::operator+(&local_2f8,&local_310,&local_328);
          msg(this,&local_2f8,index);
          Bstrlib::CBString::~CBString(&local_2f8);
          Bstrlib::CBString::~CBString(&local_328);
          Bstrlib::CBString::~CBString(&local_310);
          this_local = (FfsParser *)0x0;
          goto LAB_00133e3f;
        }
        if (baGuid.d.field_2._M_local_buf[0xe] == '\a') {
          Bstrlib::CBString::CBString(&local_340,"\nCompression algorithm: LZMAF86");
          Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_340);
          Bstrlib::CBString::~CBString(&local_340);
          uVar2 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
          uVar3 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
          usprintf(&local_358,"\nDecompressed size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
          Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_358);
          Bstrlib::CBString::~CBString(&local_358);
          usprintf(&local_370,"\nLZMA dictionary size: %Xh",(ulong)(uint)baGuid.d.field_2._8_4_);
          Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_370);
          Bstrlib::CBString::~CBString(&local_370);
        }
        else {
          Bstrlib::CBString::CBString((CBString *)&result_3,"\nCompression algorithm: unknown");
          Bstrlib::CBString::operator+=((CBString *)&dictionarySize,(CBString *)&result_3);
          Bstrlib::CBString::~CBString((CBString *)&result_3);
          baGuid.d.field_2._M_local_buf[0xf] = '\0';
        }
      }
      else {
        bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_GZIP);
        if (bVar1) {
          TreeModel::body(&local_3b0,this->model,index);
          UVar4 = gzipDecompress(&local_3b0,(UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
          UByteArray::~UByteArray(&local_3b0);
          local_390 = UVar4;
          if (UVar4 != 0) {
            usprintf(&local_3e0,"%s: decompression failed with error ","parseGuidedSectionBody");
            errorCodeToUString(&local_3f8,local_390);
            Bstrlib::CBString::operator+(&local_3c8,&local_3e0,&local_3f8);
            msg(this,&local_3c8,index);
            Bstrlib::CBString::~CBString(&local_3c8);
            Bstrlib::CBString::~CBString(&local_3f8);
            Bstrlib::CBString::~CBString(&local_3e0);
            this_local = (FfsParser *)0x0;
            goto LAB_00133e3f;
          }
          baGuid.d.field_2._M_local_buf[0xe] = '\b';
          Bstrlib::CBString::CBString(&local_410,"\nCompression algorithm: GZip");
          Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_410);
          Bstrlib::CBString::~CBString(&local_410);
          uVar2 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
          uVar3 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
          usprintf((CBString *)&result_4,"\nDecompressed size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
          Bstrlib::CBString::operator+=((CBString *)&dictionarySize,(CBString *)&result_4);
          Bstrlib::CBString::~CBString((CBString *)&result_4);
        }
        else {
          bVar1 = UByteArray::operator==((UByteArray *)&result,&EFI_GUIDED_SECTION_ZLIB_AMD);
          if (bVar1) {
            TreeModel::body(&local_450,this->model,index);
            UVar4 = zlibDecompress(&local_450,(UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
            UByteArray::~UByteArray(&local_450);
            local_430 = UVar4;
            if (UVar4 != 0) {
              usprintf(&local_480,"%s: decompression failed with error ","parseGuidedSectionBody");
              errorCodeToUString(&local_498,local_430);
              Bstrlib::CBString::operator+(&local_468,&local_480,&local_498);
              msg(this,&local_468,index);
              Bstrlib::CBString::~CBString(&local_468);
              Bstrlib::CBString::~CBString(&local_498);
              Bstrlib::CBString::~CBString(&local_480);
              this_local = (FfsParser *)0x0;
              goto LAB_00133e3f;
            }
            baGuid.d.field_2._M_local_buf[0xe] = '\t';
            Bstrlib::CBString::CBString(&local_4b0,"\nCompression algorithm: Zlib");
            Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_4b0);
            Bstrlib::CBString::~CBString(&local_4b0);
            uVar2 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
            uVar3 = UByteArray::size((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
            usprintf(&local_4c8,"\nDecompressed size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
            Bstrlib::CBString::operator+=((CBString *)&dictionarySize,&local_4c8);
            Bstrlib::CBString::~CBString(&local_4c8);
          }
        }
      }
    }
  }
  TreeModel::addInfo(this->model,index,(CBString *)&dictionarySize,true);
  acStack_4e8[0] = '\0';
  acStack_4e8[1] = '\0';
  acStack_4e8[2] = '\0';
  acStack_4e8[3] = '\0';
  acStack_4e8[4] = '\0';
  acStack_4e8[5] = '\0';
  acStack_4e8[6] = '\0';
  acStack_4e8[7] = '\0';
  pdata.guid.Data1 = 0;
  pdata.guid.Data2 = 0;
  pdata.guid.Data3 = 0;
  pdata.guid.Data4[0] = baGuid.d.field_2._8_1_;
  pdata.guid.Data4[1] = baGuid.d.field_2._9_1_;
  pdata.guid.Data4[2] = baGuid.d.field_2._10_1_;
  pdata.guid.Data4[3] = baGuid.d.field_2._11_1_;
  this_00 = this->model;
  UByteArray::UByteArray(&local_508,acStack_4e8,0x14);
  TreeModel::setParsingData(this_00,index,&local_508);
  UByteArray::~UByteArray(&local_508);
  if (baGuid.d.field_2._M_local_buf[0xe] != '\x01') {
    TreeModel::setUncompressedData
              (this->model,index,(UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
    TreeModel::setCompressed(this->model,index,true);
  }
  if ((baGuid.d.field_2._M_local_buf[0xf] & 1U) == 0) {
    usprintf(&local_520,"%s: GUID defined section can not be processed","parseGuidedSectionBody");
    msg(this,&local_520,index);
    Bstrlib::CBString::~CBString(&local_520);
    this_local = (FfsParser *)0x0;
  }
  else {
    this_local = (FfsParser *)
                 parseSections(this,(UByteArray *)((long)&efiDecompressed.d.field_2 + 8),index,true)
    ;
  }
LAB_00133e3f:
  local_16c = 1;
  UByteArray::~UByteArray((UByteArray *)&result);
  Bstrlib::CBString::~CBString((CBString *)&dictionarySize);
  UByteArray::~UByteArray((UByteArray *)&info.super_tagbstring.data);
  UByteArray::~UByteArray((UByteArray *)((long)&efiDecompressed.d.field_2 + 8));
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseGuidedSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Obtain required information from parsing data
    EFI_GUID guid = { 0, 0, 0, {0, 0, 0, 0, 0, 0, 0, 0 }};
    if (model->hasEmptyParsingData(index) == false) {
        UByteArray data = model->parsingData(index);
        const GUIDED_SECTION_PARSING_DATA* pdata = (const GUIDED_SECTION_PARSING_DATA*)data.constData();
        guid = readUnaligned(pdata).guid;
    }
    
    // Check if section requires processing
    UByteArray processed = model->body(index);
    UByteArray efiDecompressed;
    UString info;
    bool parseCurrentSection = true;
    UINT8 algorithm = COMPRESSION_ALGORITHM_NONE;
    UINT32 dictionarySize = 0;
    UByteArray baGuid = UByteArray((const char*)&guid, sizeof(EFI_GUID));
    // Tiano compressed section
    if (baGuid == EFI_GUIDED_SECTION_TIANO) {
        USTATUS result = decompress(model->body(index), EFI_STANDARD_COMPRESSION, algorithm, dictionarySize, processed, efiDecompressed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }
        
        // Check for undecided compression algorithm, this is a special case
        if (algorithm == COMPRESSION_ALGORITHM_UNDECIDED) {
            // Try preparse of sections decompressed with Tiano algorithm
            if (U_SUCCESS == parseSections(processed, index, false)) {
                algorithm = COMPRESSION_ALGORITHM_TIANO;
            }
            // Try preparse of sections decompressed with EFI 1.1 algorithm
            else if (U_SUCCESS == parseSections(efiDecompressed, index, false)) {
                algorithm = COMPRESSION_ALGORITHM_EFI11;
                processed = efiDecompressed;
            }
            else {
                msg(usprintf("%s: can't guess the correct decompression algorithm, both preparse steps are failed", __FUNCTION__), index);
                parseCurrentSection = false;
            }
        }
        
        info += UString("\nCompression algorithm: ") + compressionTypeToUString(algorithm);
        info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
    }
    // LZMA compressed section
    else if (baGuid == EFI_GUIDED_SECTION_LZMA
             || baGuid == EFI_GUIDED_SECTION_LZMA_HP
             || baGuid == EFI_GUIDED_SECTION_LZMA_MS) {
        USTATUS result = decompress(model->body(index), EFI_CUSTOMIZED_COMPRESSION, algorithm, dictionarySize, processed, efiDecompressed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }
        
        if (algorithm == COMPRESSION_ALGORITHM_LZMA) {
            info += UString("\nCompression algorithm: LZMA");
            info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
            info += usprintf("\nLZMA dictionary size: %Xh", dictionarySize);
        }
        else {
            info += UString("\nCompression algorithm: unknown");
            parseCurrentSection = false;
        }
    }
    // LZMAF86 compressed section
    else if (baGuid == EFI_GUIDED_SECTION_LZMAF86) {
        USTATUS result = decompress(model->body(index), EFI_CUSTOMIZED_COMPRESSION_LZMAF86, algorithm, dictionarySize, processed, efiDecompressed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }
        
        if (algorithm == COMPRESSION_ALGORITHM_LZMAF86) {
            info += UString("\nCompression algorithm: LZMAF86");
            info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
            info += usprintf("\nLZMA dictionary size: %Xh", dictionarySize);
        }
        else {
            info += UString("\nCompression algorithm: unknown");
            parseCurrentSection = false;
        }
    }
    // GZip compressed section
    else if (baGuid == EFI_GUIDED_SECTION_GZIP) {
        USTATUS result = gzipDecompress(model->body(index), processed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }

        algorithm = COMPRESSION_ALGORITHM_GZIP;
        info += UString("\nCompression algorithm: GZip");
        info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
    }
    // Zlib compressed section
    else if (baGuid == EFI_GUIDED_SECTION_ZLIB_AMD) {
        USTATUS result = zlibDecompress(model->body(index), processed);
        if (result) {
            msg(usprintf("%s: decompression failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            return U_SUCCESS;
        }

        algorithm = COMPRESSION_ALGORITHM_ZLIB;
        info += UString("\nCompression algorithm: Zlib");
        info += usprintf("\nDecompressed size: %Xh (%u)", (UINT32)processed.size(), (UINT32)processed.size());
    }
    
    // Add info
    model->addInfo(index, info);
    
    // Set parsing data
    GUIDED_SECTION_PARSING_DATA pdata = {};
    pdata.dictionarySize = dictionarySize;
    model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
    
    // Set compression data
    if (algorithm != COMPRESSION_ALGORITHM_NONE) {
        model->setUncompressedData(index, processed);
        model->setCompressed(index, true);
    }
    
    if (!parseCurrentSection) {
        msg(usprintf("%s: GUID defined section can not be processed", __FUNCTION__), index);
        return U_SUCCESS;
    }
    
    return parseSections(processed, index, true);
}